

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datrie.c
# Opt level: O0

void datrie_match(datrie_dictionary_desc *datrie_dictionary,ucs4_t *word,size_t *match_pos,
                 size_t *id,size_t limit)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  int j;
  int k;
  size_t p;
  size_t i;
  size_t limit_local;
  size_t *id_local;
  size_t *match_pos_local;
  ucs4_t *word_local;
  datrie_dictionary_desc *datrie_dictionary_local;
  
  p = 0;
  _j = 0;
  while( true ) {
    bVar3 = false;
    if ((word[_j] != 0) && ((limit == 0 || (bVar3 = false, _j < limit)))) {
      bVar3 = datrie_dictionary->dat[p].base != -1;
    }
    if (!bVar3) break;
    iVar1 = encode_char(word[_j]);
    uVar2 = datrie_dictionary->dat[p].base + iVar1;
    if ((((int)uVar2 < 0) || (datrie_dictionary->dat_item_count <= uVar2)) ||
       ((long)datrie_dictionary->dat[(int)uVar2].parent != p)) break;
    p = (size_t)(int)uVar2;
    _j = _j + 1;
  }
  if (match_pos != (size_t *)0x0) {
    *match_pos = _j;
  }
  if (id != (size_t *)0x0) {
    *id = p;
  }
  return;
}

Assistant:

void datrie_match(const datrie_dictionary_desc * datrie_dictionary, const ucs4_t * word,
		size_t *match_pos, size_t *id, size_t limit)
{
	size_t i, p;
	for (i = 0,p = 0; word[p] && (limit == 0 || p < limit) &&
			datrie_dictionary->dat[i].base != DATRIE_UNUSED; p ++)
	{
		int k = encode_char(word[p]);
		int j = datrie_dictionary->dat[i].base + k;
		if (j < 0 || j >= datrie_dictionary->dat_item_count || datrie_dictionary->dat[j].parent != i)
			break;
		i = j;
	}
	if (match_pos)
		*match_pos = p;
	if (id)
		*id = i;
}